

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall MyAudioDescriptor::FillDescriptor(MyAudioDescriptor *this,MXFReader *Reader)

{
  MyAudioDescriptor *pMVar1;
  MDD_t MVar2;
  char *pcVar3;
  WaveAudioDescriptor *pWVar4;
  long *plVar5;
  undefined8 uVar6;
  ILogSink *pIVar7;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> *plVar8;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  MCALabelSubDescriptor *p;
  MXFReader *local_228;
  MyAudioDescriptor *local_220;
  char buf [64];
  Result_t local_1d0 [104];
  Result_t local_168 [104];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  plVar8 = &object_list;
  MVar2 = ASDCP::DefaultCompositeDict();
  pcVar3 = (char *)ASDCP::Dictionary::Type(MVar2);
  buf[8] = '\x01';
  buf._9_8_ = *(undefined8 *)pcVar3;
  buf._17_8_ = *(undefined8 *)(pcVar3 + 8);
  buf._0_8_ = &PTR__IArchive_00115ae8;
  pWVar4 = get_descriptor_by_type<AS_02::PCM::MXFReader,ASDCP::MXF::WaveAudioDescriptor>
                     (Reader,(UL *)buf);
  this->m_WaveAudioDescriptor = pWVar4;
  if (pWVar4 == (WaveAudioDescriptor *)0x0) {
    pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar7,"Audio descriptor not found.\n");
  }
  else {
    (this->super_AudioDescriptor).AudioSamplingRate = *(Rational *)(pWVar4 + 0xf0);
    if (pWVar4[0x100] == (WaveAudioDescriptor)0x1) {
      (this->super_AudioDescriptor).ContainerDuration = *(ui32_t *)(pWVar4 + 0xf8);
    }
  }
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size = 0;
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&object_list;
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&object_list;
  plVar5 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar2 = ASDCP::DefaultCompositeDict();
  uVar6 = ASDCP::Dictionary::Type(MVar2);
  (**(code **)(*plVar5 + 0xb0))(local_98,plVar5,uVar6,&object_list);
  Kumu::Result_t::~Result_t(local_98);
  plVar5 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar2 = ASDCP::DefaultCompositeDict();
  uVar6 = ASDCP::Dictionary::Type(MVar2);
  (**(code **)(*plVar5 + 0xb0))(local_100,plVar5,uVar6,&object_list);
  Kumu::Result_t::~Result_t(local_100);
  plVar5 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar2 = ASDCP::DefaultCompositeDict();
  uVar6 = ASDCP::Dictionary::Type(MVar2);
  (**(code **)(*plVar5 + 0xb0))(local_168,plVar5,uVar6,&object_list);
  local_228 = Reader;
  Kumu::Result_t::~Result_t(local_168);
  local_220 = this;
LAB_0010eec8:
  do {
    plVar8 = *(list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               **)plVar8;
    if (plVar8 == &object_list) {
      std::__cxx11::
      list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::clear
                (&object_list);
      plVar5 = (long *)(**(code **)(*(long *)local_228 + 0x10))();
      pMVar1 = local_220;
      MVar2 = ASDCP::DefaultCompositeDict();
      uVar6 = ASDCP::Dictionary::Type(MVar2);
      (**(code **)(*plVar5 + 0xb0))(local_1d0,plVar5,uVar6,&object_list);
      Kumu::Result_t::~Result_t(local_1d0);
      if (object_list.
          super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&object_list) {
        pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar7,"MXF Metadata contains no Track Sets.\n");
      }
      (pMVar1->super_AudioDescriptor).EditRate =
           (Rational)
           object_list.
           super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[0x10]._M_prev;
      std::__cxx11::
      _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ::_M_clear(&object_list.
                  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                );
      return;
    }
    if (*(long *)((long)plVar8 + 0x10) == 0) {
      p = (MCALabelSubDescriptor *)0x0;
    }
    else {
      p = (MCALabelSubDescriptor *)
          __dynamic_cast(*(long *)((long)plVar8 + 0x10),&ASDCP::MXF::InterchangeObject::typeinfo,
                         &ASDCP::MXF::MCALabelSubDescriptor::typeinfo,0);
      if (p != (MCALabelSubDescriptor *)0x0) {
        std::__cxx11::
        list<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
        ::push_back(&this->m_ChannelDescriptorList,&p);
        goto LAB_0010eec8;
      }
    }
    pIVar7 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar3 = Kumu::UUID::EncodeHex((UUID *)(*(long *)((long)plVar8 + 0x10) + 0x58),buf,0x40);
    Kumu::ILogSink::Error(pIVar7,"Audio sub-descriptor type error.\n",pcVar3);
  } while( true );
}

Assistant:

void FillDescriptor(AS_02::PCM::MXFReader& Reader)
  {
    m_WaveAudioDescriptor = get_descriptor_by_type<AS_02::PCM::MXFReader, WaveAudioDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_WaveAudioDescriptor));

    if ( m_WaveAudioDescriptor != 0 )
      {
	AudioSamplingRate = m_WaveAudioDescriptor->SampleRate;
        if ( ! m_WaveAudioDescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_WaveAudioDescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Audio descriptor not found.\n");
      }

    std::list<InterchangeObject*> object_list;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_AudioChannelLabelSubDescriptor), object_list);
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_SoundfieldGroupLabelSubDescriptor), object_list);
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor), object_list);

    std::list<InterchangeObject*>::iterator i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
	MCALabelSubDescriptor *p = dynamic_cast<MCALabelSubDescriptor*>(*i);

	if ( p )
	  {
	    m_ChannelDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("Audio sub-descriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), object_list);
    
    if ( object_list.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    EditRate = ((Track*)object_list.front())->EditRate;
  }